

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

bool __thiscall
llvm::yaml::Scanner::scanBlockScalarIndent
          (Scanner *this,uint BlockIndent,uint BlockExitIndent,bool *IsDone)

{
  char *pcVar1;
  uint uVar2;
  iterator pcVar3;
  Twine local_40;
  
  uVar2 = this->Column;
  pcVar3 = this->Current;
  while (((uVar2 < BlockIndent && (pcVar3 != this->End)) && (*pcVar3 == ' '))) {
    pcVar3 = pcVar3 + 1;
    this->Current = pcVar3;
    uVar2 = uVar2 + 1;
    this->Column = uVar2;
  }
  pcVar3 = skip_nb_char(this,pcVar3);
  pcVar1 = this->Current;
  if (pcVar3 == pcVar1) {
    return true;
  }
  if (BlockExitIndent < this->Column) {
    if (BlockIndent <= this->Column) {
      return true;
    }
    if ((pcVar1 == this->End) || (*pcVar1 != '#')) {
      Twine::Twine(&local_40,"A text line is less indented than the block scalar");
      setError(this,&local_40,this->Current);
      return false;
    }
  }
  *IsDone = true;
  return true;
}

Assistant:

bool Scanner::scanBlockScalarIndent(unsigned BlockIndent,
                                    unsigned BlockExitIndent, bool &IsDone) {
  // Skip the indentation.
  while (Column < BlockIndent) {
    auto I = skip_s_space(Current);
    if (I == Current)
      break;
    Current = I;
    ++Column;
  }

  if (skip_nb_char(Current) == Current)
    return true;

  if (Column <= BlockExitIndent) { // End of the block literal.
    IsDone = true;
    return true;
  }

  if (Column < BlockIndent) {
    if (Current != End && *Current == '#') { // Trailing comment.
      IsDone = true;
      return true;
    }
    setError("A text line is less indented than the block scalar", Current);
    return false;
  }
  return true; // A normal text line.
}